

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamWriterPrivate::Close(BamWriterPrivate *this)

{
  bool bVar1;
  BamException *e;
  BgzfStream *in_stack_fffffffffffffff0;
  
  bVar1 = IsOpen((BamWriterPrivate *)0x1a3857);
  if (bVar1) {
    BgzfStream::Close(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void BamWriterPrivate::Close()
{

    // skip if file not open
    if (!IsOpen()) {
        return;
    }

    // close output stream
    try {
        m_stream.Close();
    } catch (const BamException& e) {
        m_errorString = e.what();
    }
}